

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.cc
# Opt level: O2

void __thiscall Monitor::print(Monitor *this,Stats *stats)

{
  int iVar1;
  tm *__tp;
  ostream *poVar2;
  long lVar3;
  float fVar4;
  time_t t;
  stringstream ss;
  array<char,_128UL> tsbuf;
  allocator local_255;
  float local_254;
  string local_250 [32];
  time_t local_230;
  stringstream local_228 [16];
  long local_218 [3];
  uint auStack_200 [88];
  char local_a0 [128];
  
  fVar4 = log10f((float)(((this->interval_).__r / 1000) * 0x3c));
  local_254 = ceilf(fVar4);
  local_230 = time((time_t *)0x0);
  __tp = gmtime(&local_230);
  strftime(local_a0,0x80,"%Y-%m-%dT%H:%M:%SZ",__tp);
  std::__cxx11::stringstream::stringstream(local_228);
  *(uint *)((long)auStack_200 + *(long *)(local_218[0] + -0x18)) =
       *(uint *)((long)auStack_200 + *(long *)(local_218[0] + -0x18)) & 0xfffffefb | 4;
  std::__cxx11::string::string(local_250,local_a0,&local_255);
  poVar2 = std::operator<<((ostream *)local_218,local_250);
  std::operator<<(poVar2," [monitor] ");
  std::__cxx11::string::~string(local_250);
  poVar2 = std::operator<<((ostream *)local_218,"gain: ");
  lVar3 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 2;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 5;
  fVar4 = anon_unknown.dwarf_6c60c::avg<float>(&stats->gain);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar4);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)local_218,"freq: ");
  lVar3 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 1;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
  fVar4 = anon_unknown.dwarf_6c60c::avg<float>(&stats->frequency);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar4);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)local_218,"omega: ");
  lVar3 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 8) = 3;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 5;
  fVar4 = anon_unknown.dwarf_6c60c::avg<float>(&stats->omega);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar4);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)local_218,"vit(avg): ");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 4;
  lVar3 = (long)(stats->viterbiErrors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(stats->viterbiErrors).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = anon_unknown.dwarf_6c60c::sum<int>(&stats->viterbiErrors);
    iVar1 = (int)((ulong)(long)iVar1 / (ulong)(lVar3 >> 2));
  }
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)local_218,"rs(sum): ");
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 4;
  iVar1 = anon_unknown.dwarf_6c60c::sum<int>(&stats->reedSolomonErrors);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)local_218,"packets: ");
  iVar1 = (int)local_254;
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)iVar1;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,stats->totalOK);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)local_218,"drops: ");
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)iVar1;
  std::ostream::operator<<(poVar2,stats->totalDropped);
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<((ostream *)&std::cout,local_250);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::stringstream::~stringstream(local_228);
  return;
}

Assistant:

void Monitor::print(const Stats& stats) {
  auto sec = std::chrono::duration_cast<std::chrono::seconds>(interval_).count();

  // Upper bound of 60 packets per second (HRIT)
  const auto packetWidth = ceilf(log10f(sec * 60));

  // std::put_time is not available in GCC < 5
  std::time_t t = std::time(nullptr);
  std::array<char, 128> tsbuf;
  strftime(tsbuf.data(), tsbuf.size(), "%Y-%m-%dT%H:%M:%SZ", std::gmtime(&t));

  std::stringstream ss;
  ss << std::fixed;
  ss << std::string(tsbuf.data())
     << " [monitor] ";
  ss << "gain: "
     << std::setprecision(2) << std::setw(5)
     << avg(stats.gain) << ", ";
  ss << "freq: "
     << std::setprecision(1) << std::setw(7)
     << avg(stats.frequency) << ", ";
  ss << "omega: "
     << std::setprecision(3) << std::setw(5)
     << avg(stats.omega) << ", ";
  ss << "vit(avg): "
     << std::setw(4)
     << avg(stats.viterbiErrors) << ", ";
  ss << "rs(sum): "
     << std::setw(4)
     << sum(stats.reedSolomonErrors) << ", ";
  ss << "packets: "
     << std::setw(packetWidth)
     << stats.totalOK << ", ";
  ss << "drops: "
     << std::setw(packetWidth)
     << stats.totalDropped;
  std::cout << ss.str() << std::endl;
}